

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NaCuFunc.cpp
# Opt level: O0

void __thiscall NaCustomFunc::Clean(NaCustomFunc *this)

{
  long in_RDI;
  NaVector *unaff_retaddr;
  long lVar1;
  uint n;
  
  lVar1 = in_RDI;
  if (*(long *)(in_RDI + 0x40) != 0) {
    if (*(void **)(in_RDI + 0x40) != (void *)0x0) {
      operator_delete__(*(void **)(in_RDI + 0x40));
    }
    *(undefined8 *)(in_RDI + 0x40) = 0;
  }
  n = (uint)((ulong)lVar1 >> 0x20);
  if (*(long *)(in_RDI + 0x48) != 0) {
    if (*(void **)(in_RDI + 0x48) != (void *)0x0) {
      operator_delete__(*(void **)(in_RDI + 0x48));
    }
    *(undefined8 *)(in_RDI + 0x48) = 0;
  }
  NaVector::new_dim(unaff_retaddr,n);
  if (*(long *)(in_RDI + 0x70) != 0) {
    if (*(long **)(in_RDI + 0x70) != (long *)0x0) {
      (**(code **)(**(long **)(in_RDI + 0x70) + 0x10))();
    }
    *(undefined8 *)(in_RDI + 0x70) = 0;
  }
  if (*(long *)(in_RDI + 0x68) != 0) {
    dlclose(*(undefined8 *)(in_RDI + 0x68));
    *(undefined8 *)(in_RDI + 0x68) = 0;
  }
  return;
}

Assistant:

void
NaCustomFunc::Clean ()
{
  if(NULL != szFile){
    delete[] szFile;
    szFile = NULL;
  }
  if(NULL != szOptions){
    delete[] szOptions;
    szOptions = NULL;
  }
  vInitial.new_dim(0);

  if(NULL != exfunc){
    delete exfunc;
    exfunc = NULL;
  }
  if(NULL != so){
#ifdef WIN32
    FreeLibrary(so);
#else
    dlclose(so);
#endif
    so = NULL;
  }
}